

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrintVisitor.cpp
# Opt level: O0

void __thiscall PrintVisitor::visit(PrintVisitor *this,FunctionCallStatementNode *node)

{
  ostream *poVar1;
  ExpressionNode *pEVar2;
  ostream *in_RDI;
  PrintVisitor visitor;
  undefined8 in_stack_ffffffffffffff80;
  uint indentation;
  PrintVisitor *this_00;
  PrintVisitor *in_stack_ffffffffffffffa8;
  string local_30 [48];
  
  indentation = (uint)((ulong)in_stack_ffffffffffffff80 >> 0x20);
  this_00 = *(PrintVisitor **)(in_RDI + 8);
  indent_abi_cxx11_(in_stack_ffffffffffffffa8);
  poVar1 = std::operator<<((ostream *)this_00,local_30);
  std::operator<<(poVar1,"FunctionCallStatementNode:\n");
  std::__cxx11::string::~string(local_30);
  PrintVisitor(this_00,in_RDI,indentation);
  pEVar2 = FunctionCallStatementNode::getFunctionCall((FunctionCallStatementNode *)0x16854e);
  (*(pEVar2->super_Node)._vptr_Node[2])(pEVar2,&stack0xffffffffffffffa8);
  ~PrintVisitor((PrintVisitor *)0x168574);
  return;
}

Assistant:

void PrintVisitor::visit(const FunctionCallStatementNode& node)
{
  stream_ << indent() << "FunctionCallStatementNode:\n";
  auto visitor = PrintVisitor{stream_, indentation_ + 1};
  node.getFunctionCall().accept(visitor);
}